

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void canvas_howputnew(_glist *x,int *connectp,int *xpixp,int *ypixp,int *indexp,int *totalp)

{
  t_gobj *ptVar1;
  byte local_79;
  t_gobj *selected;
  t_gobj *g;
  int local_60;
  int connectme;
  int y2;
  int y1;
  int x2;
  int x1;
  int n2;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  float dx;
  int *totalp_local;
  int *indexp_local;
  int *ypixp_local;
  int *xpixp_local;
  int *connectp_local;
  _glist *x_local;
  
  ypix = (int)((float)x->gl_zoom * 5.5);
  n2 = 0;
  x1 = 0;
  local_79 = 0;
  if ((x->gl_editor->e_selection != (t_selection *)0x0) &&
     (local_79 = 0, x->gl_editor->e_selection->sel_next == (_selection *)0x0)) {
    local_79 = sys_noautopatch != 0 ^ 0xff;
  }
  _xpix = totalp;
  totalp_local = indexp;
  indexp_local = ypixp;
  ypixp_local = xpixp;
  xpixp_local = connectp;
  connectp_local = (int *)x;
  glist_nograb(x);
  if ((local_79 & 1) == 0) {
    glist_getnextxy((_glist *)connectp_local,ypixp_local,indexp_local);
    *ypixp_local = *ypixp_local / connectp_local[0x3b] + -3;
    *indexp_local = *indexp_local / connectp_local[0x3b] + -3;
    glist_noselect((_glist *)connectp_local);
  }
  else {
    ptVar1 = (t_gobj *)**(long **)(*(long *)(connectp_local + 0x30) + 0x20);
    selected = *(t_gobj **)(connectp_local + 0xc);
    x1 = 0;
    for (; selected != (t_gobj *)0x0; selected = selected->g_next) {
      x1 = x1 + 1;
    }
    glist_noselect((_glist *)connectp_local);
    selected = *(t_gobj **)(connectp_local + 0xc);
    x2 = 0;
    for (; selected != (t_gobj *)0x0; selected = selected->g_next) {
      if (selected == ptVar1) {
        n2 = x2;
        break;
      }
      if (selected->g_next == (_gobj *)0x0) {
        n2 = x1 + -1;
        break;
      }
      x2 = x2 + 1;
    }
    if (selected == (t_gobj *)0x0) {
      glist_getnextxy((_glist *)connectp_local,ypixp_local,indexp_local);
      *ypixp_local = *ypixp_local / connectp_local[0x3b] + -3;
      *indexp_local = *indexp_local / connectp_local[0x3b] + -3;
    }
    else {
      gobj_getrect(selected,(_glist *)connectp_local,&y1,&connectme,&y2,&local_60);
      *ypixp_local = y1 / connectp_local[0x3b];
      *indexp_local = (int)(((float)local_60 + (float)ypix) / (float)connectp_local[0x3b]);
    }
  }
  *xpixp_local = (uint)(local_79 & 1);
  *totalp_local = n2;
  *_xpix = x1;
  return;
}

Assistant:

static void canvas_howputnew(t_canvas *x, int *connectp, int *xpixp, int *ypixp,
    int *indexp, int *totalp)
{
    float dx = 5.5 * x->gl_zoom;
    int xpix, ypix, indx = 0, nobj = 0, n2, x1, x2, y1, y2;
    int connectme = (x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next && !sys_noautopatch);
    glist_nograb(x);
    if (connectme)
    {
        t_gobj *g, *selected = x->gl_editor->e_selection->sel_what;
            /* get number of objects */
        for (g = x->gl_list, nobj = 0; g; g = g->g_next, nobj++) ;

            /* deselect the current selection (and create pending objects) */
        glist_noselect(x);

            /* search back for 'selected' and if it isn't on the list,
                plan just to connect from the last item on the list. */
        for (g = x->gl_list, n2 = 0; g; g = g->g_next, n2++)
        {
            if (g == selected)
            {
                indx = n2;
                break;
            }
            else if (!g->g_next) {
                    /* we couldn't find the selected object any more
                     * this probably means, that it was replaced by a newly
                     * created object, which is now the last on the list.
                     */
                indx = nobj-1;
                break;
            }
        }
            /* so where do we put the new object?
               just below the one we connect from! */
        if(g) {
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            *xpixp = x1 / x->gl_zoom;
            *ypixp = (y2+dx) / x->gl_zoom;  /* 5 pixels down, rounded */
        } else {
                /* just in case */
            glist_getnextxy(x, xpixp, ypixp);
            *xpixp = *xpixp/x->gl_zoom - 3;
            *ypixp = *ypixp/x->gl_zoom - 3;
        }
    }
    else
    {
        glist_getnextxy(x, xpixp, ypixp);
        *xpixp = *xpixp/x->gl_zoom - 3;
        *ypixp = *ypixp/x->gl_zoom - 3;
        glist_noselect(x);
    }
    *connectp = connectme;
    *indexp = indx;
    *totalp = nobj;
}